

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O3

void chan_enable(opl_channel *channel)

{
  Bit8u BVar1;
  
  if (((channel->chip->newm == '\0') || (BVar1 = channel->chtype, BVar1 == '\0')) ||
     (BVar1 == '\x03')) {
    eg_keyon(channel->slots[0],'\x01');
  }
  else {
    if (BVar1 != '\x01') {
      return;
    }
    eg_keyon(channel->slots[0],'\x01');
    eg_keyon(channel->slots[1],'\x01');
    eg_keyon(channel->pair->slots[0],'\x01');
    channel = channel->pair;
  }
  eg_keyon(channel->slots[1],'\x01');
  return;
}

Assistant:

void chan_enable(opl_channel *channel) {
	if (channel->chip->newm) {
		if (channel->chtype == ch_4op) {
			eg_keyon(channel->slots[0], egk_norm);
			eg_keyon(channel->slots[1], egk_norm);
			eg_keyon(channel->pair->slots[0], egk_norm);
			eg_keyon(channel->pair->slots[1], egk_norm);
		}
		else if (channel->chtype == ch_2op || channel->chtype == ch_drum) {
			eg_keyon(channel->slots[0], egk_norm);
			eg_keyon(channel->slots[1], egk_norm);
		}
	}
	else {
		eg_keyon(channel->slots[0], egk_norm);
		eg_keyon(channel->slots[1], egk_norm);
	}
}